

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::ParsedPatternInfo::consumeFormat(ParsedPatternInfo *this,UErrorCode *status)

{
  UBool UVar1;
  UChar32 UVar2;
  UErrorCode *status_local;
  ParsedPatternInfo *this_local;
  
  consumeIntegerFormat(this,status);
  UVar1 = ::U_FAILURE(*status);
  if ((UVar1 == '\0') && (UVar2 = ParserState::peek(&this->state), UVar2 == 0x2e)) {
    ParserState::next(&this->state);
    this->currentSubpattern->hasDecimal = true;
    this->currentSubpattern->widthExceptAffixes = this->currentSubpattern->widthExceptAffixes + 1;
    consumeFractionFormat(this,status);
    ::U_FAILURE(*status);
  }
  return;
}

Assistant:

void ParsedPatternInfo::consumeFormat(UErrorCode& status) {
    consumeIntegerFormat(status);
    if (U_FAILURE(status)) { return; }
    if (state.peek() == u'.') {
        state.next(); // consume the decimal point
        currentSubpattern->hasDecimal = true;
        currentSubpattern->widthExceptAffixes += 1;
        consumeFractionFormat(status);
        if (U_FAILURE(status)) { return; }
    }
}